

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O0

ReconstructState __thiscall
wasm::ReconstructStringifyWalker::getCurrState(ReconstructStringifyWalker *this)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  Module *this_00;
  Function *pFVar4;
  ReconstructStringifyWalker *this_local;
  
  uVar1 = this->seqCounter;
  sVar2 = std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::size
                    (&this->sequences);
  if (((uVar1 < sVar2) &&
      (uVar1 = this->instrCounter,
      pvVar3 = std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::
               operator[](&this->sequences,(ulong)this->seqCounter), pvVar3->startIdx <= uVar1)) &&
     (uVar1 = this->instrCounter,
     pvVar3 = std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::
              operator[](&this->sequences,(ulong)this->seqCounter), uVar1 < pvVar3->endIdx)) {
    this_00 = Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
              ::getModule((Walker<wasm::ReconstructStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::ReconstructStringifyWalker,_void>_>
                           *)this);
    pvVar3 = std::vector<wasm::OutliningSequence,_std::allocator<wasm::OutliningSequence>_>::
             operator[](&this->sequences,(ulong)this->seqCounter);
    pFVar4 = Module::getFunction(this_00,(Name)(pvVar3->func).super_IString.str);
    this_local._4_4_ = InSeq;
    if (pFVar4->body != (Expression *)0x0) {
      this_local._4_4_ = InSkipSeq;
    }
  }
  else {
    this_local._4_4_ = NotInSeq;
  }
  return this_local._4_4_;
}

Assistant:

ReconstructState getCurrState() {
    // We are either in a sequence or not in a sequence. If we are in a sequence
    // and have already created the body of the outlined function that will be
    // called, then we will skip instructions, otherwise we add the instructions
    // to the outlined function. If we are not in a sequence, then the
    // instructions are sent to the existing function.
    if (seqCounter < sequences.size() &&
        instrCounter >= sequences[seqCounter].startIdx &&
        instrCounter < sequences[seqCounter].endIdx) {
      return getModule()->getFunction(sequences[seqCounter].func)->body
               ? InSkipSeq
               : InSeq;
    }
    return NotInSeq;
  }